

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O1

uint8_t * __thiscall
Lodtalk::MethodAssembler::SendMessage::encode(SendMessage *this,uint8_t *buffer)

{
  int iVar1;
  uint uVar2;
  uint8_t *extraout_RAX;
  uint8_t uVar3;
  undefined7 uVar4;
  undefined1 uVar5;
  
  uVar5 = SUB81(this,0);
  uVar4 = (undefined7)((ulong)this >> 8);
  iVar1 = this->argumentCount;
  if (iVar1 == 2) {
    if (this->selectorIndex < 0x10) {
      uVar3 = (char)this->selectorIndex + 0xa0;
      goto LAB_0013f0ae;
    }
  }
  else if (iVar1 == 1) {
    if (this->selectorIndex < 0x10) {
      uVar3 = (char)this->selectorIndex + 0x90;
      goto LAB_0013f0ae;
    }
  }
  else if ((iVar1 == 0) && (this->selectorIndex < 0x10)) {
    uVar3 = (char)this->selectorIndex + 0x80;
LAB_0013f0ae:
    *buffer = uVar3;
    return buffer + 1;
  }
  if (iVar1 < 8) {
    if (this->selectorIndex < 0x20) {
      *buffer = 0xea;
      buffer[1] = ((byte)this->argumentCount & 7) + (char)this->selectorIndex * '\b';
      return buffer + 2;
    }
  }
  else {
    encode();
  }
  encode();
  iVar1 = *(int *)(CONCAT71(uVar4,uVar5) + 0x28);
  uVar2 = *(uint *)(CONCAT71(uVar4,uVar5) + 0x2c);
  uVar5 = uVar2 < 3;
  if (!(bool)uVar5 || 0xf < iVar1) {
    if ((int)uVar2 < 8) {
      if (iVar1 < 0x20) {
        return (uint8_t *)0x2;
      }
    }
    else {
      computeMaxSize();
    }
    computeMaxSize();
    operator_delete((void *)CONCAT71(uVar4,uVar5));
    return extraout_RAX;
  }
  return &DAT_00000001;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(argumentCount == 0 && selectorIndex < BytecodeSet::SendShortArgs0RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs0First + selectorIndex);
			return buffer;
		}
		if(argumentCount == 1 && selectorIndex < BytecodeSet::SendShortArgs1RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs1First + selectorIndex);
			return buffer;
		}
		if(argumentCount == 2 && selectorIndex < BytecodeSet::SendShortArgs2RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs2First + selectorIndex);
			return buffer;
		}

		if(argumentCount > BytecodeSet::Send_ArgumentCountMask)
			LODTALK_UNIMPLEMENTED();

		if(selectorIndex > BytecodeSet::Send_LiteralIndexMask)
			LODTALK_UNIMPLEMENTED();

		*buffer++ = BytecodeSet::Send;
		*buffer++ = (argumentCount & BytecodeSet::Send_ArgumentCountMask) |
			((selectorIndex & BytecodeSet::Send_LiteralIndexMask) << BytecodeSet::Send_LiteralIndexShift);
		return buffer;
	}